

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceFieldTest_TestOStreamLong_Test::TestBody
          (PriceFieldTest_TestOStreamLong_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_200;
  Message local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  PriceField local_28 [8];
  PriceField field;
  int64_t value;
  PriceFieldTest_TestOStreamLong_Test *this_local;
  
  bidfx_public_api::price::PriceField::PriceField(local_28,0x85e0b0cba7);
  std::__cxx11::stringstream::stringstream(local_1b0);
  bidfx_public_api::price::operator<<(local_1a0,local_28);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[13],std::__cxx11::string>
            ((EqHelper<false> *)local_1d0,"\"575000333223\"","ss.str()",
             (char (*) [13])"575000333223",&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x51,message);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  bidfx_public_api::price::PriceField::~PriceField(local_28);
  return;
}

Assistant:

TEST(PriceFieldTest, TestOStreamLong)
{
    int64_t value = 575000333223;
    PriceField field = PriceField(value);
    std::stringstream ss;
    ss << field;
    EXPECT_EQ("575000333223", ss.str());
}